

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgst02.c
# Opt level: O1

int cgst02(trans_t trans,int m,int n,int nrhs,SuperMatrix *A,singlecomplex *x,int ldx,
          singlecomplex *b,int ldb,float *resid)

{
  ulong uVar1;
  bool bVar2;
  float fVar3;
  real rVar4;
  float fVar5;
  float fVar6;
  char transc [1];
  int n2;
  int n1;
  float local_40;
  float local_3c;
  float local_38;
  int c__1;
  
  c__1 = 1;
  fVar3 = 0.0;
  if (nrhs != 0 && (0 < n && 0 < m)) {
    bVar2 = trans - TRANS < 2;
    n2 = n;
    if (bVar2) {
      n2 = m;
      m = n;
    }
    transc[0] = 'N';
    if (bVar2) {
      transc[0] = 'T';
    }
    n1 = m;
    fVar3 = smach("Epsilon");
    local_40 = clangs("1",A);
    if (0.0 < local_40) {
      sp_cgemm(transc,"N",n1,nrhs,n2,(singlecomplex)0xbf800000,A,x,ldx,(singlecomplex)0x3f800000,b,
               ldb);
      *resid = 0.0;
      if (nrhs < 1) {
        return 0;
      }
      local_3c = 1.0 / fVar3;
      uVar1 = (ulong)(uint)nrhs;
      do {
        local_38 = scasum_(&n1,b,&c__1);
        rVar4 = scasum_(&n2,x,&c__1);
        fVar5 = local_3c;
        if (0.0 < rVar4) {
          fVar6 = ((local_38 / local_40) / rVar4) / fVar3;
          fVar5 = *resid;
          if (*resid <= fVar6) {
            fVar5 = fVar6;
          }
        }
        *resid = fVar5;
        x = x + ldx;
        b = b + ldb;
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
      return 0;
    }
    fVar3 = 1.0 / fVar3;
  }
  *resid = fVar3;
  return 0;
}

Assistant:

int cgst02(trans_t trans, int m, int n, int nrhs, SuperMatrix *A,
           singlecomplex *x, int ldx, singlecomplex *b, int ldb, float *resid)
{
    /* Table of constant values */
    singlecomplex alpha = {-1., 0.0};
    singlecomplex beta  = {1., 0.0};
    int    c__1  = 1;
    
    /* System generated locals */
    float d__1, d__2;

    /* Local variables */
    int j;
    int n1, n2;
    float anorm, bnorm;
    float xnorm;
    float eps;
    char transc[1];

    /* Function prototypes */
    extern float clangs(char *, SuperMatrix *);
    extern float scasum_(int *, singlecomplex *, int *);
    
    /* Function Body */
    if ( m <= 0 || n <= 0 || nrhs == 0) {
	*resid = 0.;
	return 0;
    }

    if ( (trans == TRANS) || (trans == CONJ) ) {
	n1 = n;
	n2 = m;
        *transc = 'T';
    } else {
	n1 = m;
	n2 = n;
	*transc = 'N';
    }

    /* Exit with RESID = 1/EPS if ANORM = 0. */
    eps = smach("Epsilon");
    anorm = clangs("1", A);
    if (anorm <= 0.) {
	*resid = 1. / eps;
	return 0;
    }

    /* Compute  B - A*X  (or  B - A'*X ) and store in B. */

    sp_cgemm(transc, "N", n1, nrhs, n2, alpha, A, x, ldx, beta, b, ldb);

    /* Compute the maximum over the number of right hand sides of   
       norm(B - A*X) / ( norm(A) * norm(X) * EPS ) . */

    *resid = 0.;
    for (j = 0; j < nrhs; ++j) {
	bnorm = scasum_(&n1, &b[j*ldb], &c__1);
	xnorm = scasum_(&n2, &x[j*ldx], &c__1);
	if (xnorm <= 0.) {
	    *resid = 1. / eps;
	} else {
	    /* Computing MAX */
	    d__1 = *resid, d__2 = bnorm / anorm / xnorm / eps;
	    *resid = SUPERLU_MAX(d__1, d__2);
	}
    }

    return 0;

}